

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnWriter::HandleRepeatLevels
          (ColumnWriter *this,ColumnWriterState *state,ColumnWriterState *parent,idx_t count,
          idx_t max_repeat)

{
  ulong uVar1;
  pointer puVar2;
  iterator __position;
  
  if (parent != (ColumnWriterState *)0x0) {
    __position._M_current =
         (state->repetition_levels).super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish;
    uVar1 = (long)__position._M_current -
            (long)(state->repetition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_start;
    puVar2 = (parent->repetition_levels).
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar1 < (ulong)((long)(parent->repetition_levels).
                              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
      do {
        if (__position._M_current ==
            (state->repetition_levels).super_vector<unsigned_short,_std::allocator<unsigned_short>_>
            .super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_short,std::allocator<unsigned_short>>::
          _M_realloc_insert<unsigned_short_const&>
                    ((vector<unsigned_short,std::allocator<unsigned_short>> *)
                     &state->repetition_levels,__position,(unsigned_short *)((long)puVar2 + uVar1));
        }
        else {
          *__position._M_current = *(unsigned_short *)((long)puVar2 + uVar1);
          (state->repetition_levels).super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        __position._M_current =
             (state->repetition_levels).
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
        uVar1 = (long)__position._M_current -
                (long)(state->repetition_levels).
                      super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start;
        puVar2 = (parent->repetition_levels).
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar1 < (ulong)((long)(parent->repetition_levels).
                                     super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2));
    }
  }
  return;
}

Assistant:

void ColumnWriter::HandleRepeatLevels(ColumnWriterState &state, ColumnWriterState *parent, idx_t count,
                                      idx_t max_repeat) const {
	if (!parent) {
		// no repeat levels without a parent node
		return;
	}
	while (state.repetition_levels.size() < parent->repetition_levels.size()) {
		state.repetition_levels.push_back(parent->repetition_levels[state.repetition_levels.size()]);
	}
}